

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)2,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  ushort in_CX;
  u32 *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  Ea<(moira::Mode)2,_(moira::Size)1> dst;
  Imu src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  StrWriter *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  Imu in_stack_ffffffffffffffd4;
  Imu local_20;
  ushort local_1a;
  u32 *local_18;
  StrWriter *local_10;
  
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  v = dasmRead<(moira::Size)1>
                ((Moira *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (u32 *)in_RDI);
  Imu::Imu(&local_20,v);
  Op<(moira::Mode)2,(moira::Size)1>
            ((Ea<(moira::Mode)2,_(moira::Size)1> *)&stack0xffffffffffffffcc,in_RDI,local_1a & 7,
             local_18);
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(in_RDI->tab).raw);
  pSVar1 = StrWriter::operator<<(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd4);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             (Ea<(moira::Mode)2,_(moira::Size)1> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}